

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_perhapsrewind(Curl_easy *data,connectdata *conn)

{
  long lVar1;
  _Bool _Var2;
  curl_off_t cVar3;
  char *pcVar4;
  char *local_78;
  char *local_68;
  bool local_51;
  ulong local_50;
  char *local_48;
  char *ongoing_auth;
  _Bool abort_upload;
  _Bool needs_rewind;
  _Bool little_upload_remains;
  curl_off_t upload_remain;
  curl_off_t expectsend;
  curl_off_t bytessent;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  lVar1 = (data->req).writebytecount;
  cVar3 = Curl_creader_total_length(data);
  if (cVar3 < 0) {
    local_50 = 0xffffffffffffffff;
  }
  else {
    local_50 = cVar3 - lVar1;
  }
  local_51 = 1999 < local_50;
  _Var2 = Curl_creader_needs_rewind(data);
  local_51 = (*(uint *)&(data->req).field_0xd1 >> 8 & 1) == 0 && local_51;
  local_48 = (char *)0x0;
  if (_Var2) {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      Curl_infof(data,"Need to rewind upload for next request");
    }
    Curl_creader_set_rewind(data,true);
  }
  if (((ulong)conn->bits >> 5 & 1) == 0) {
    if (((local_51) &&
        (((data->state).authproxy.picked == 8 || ((data->state).authhost.picked == 8)))) &&
       ((local_48 = "NTLM", conn->http_ntlm_state != NTLMSTATE_NONE ||
        (conn->proxy_ntlm_state != NTLMSTATE_NONE)))) {
      local_51 = false;
    }
    if (local_51) {
      if ((long)local_50 < 0) {
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
          if (local_48 == (char *)0x0) {
            local_78 = "";
          }
          else {
            local_78 = local_48;
          }
          pcVar4 = "";
          if (local_48 != (char *)0x0) {
            pcVar4 = " send, ";
          }
          Curl_infof(data,"%s%sclose instead of sending unknown amount of more bytes",local_78,
                     pcVar4);
        }
      }
      else if (((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) {
        if (local_48 == (char *)0x0) {
          local_68 = "";
        }
        else {
          local_68 = local_48;
        }
        pcVar4 = "";
        if (local_48 != (char *)0x0) {
          pcVar4 = " send, ";
        }
        Curl_infof(data,"%s%sclose instead of sending %ld more bytes",local_68,pcVar4,local_50);
      }
      Curl_conncontrol(conn,2);
      (data->req).size = 0;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode http_perhapsrewind(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  curl_off_t bytessent = data->req.writebytecount;
  curl_off_t expectsend = Curl_creader_total_length(data);
  curl_off_t upload_remain = (expectsend >= 0) ? (expectsend - bytessent) : -1;
  bool little_upload_remains = (upload_remain >= 0 && upload_remain < 2000);
  bool needs_rewind = Curl_creader_needs_rewind(data);
  /* By default, we would like to abort the transfer when little or unknown
   * amount remains. This may be overridden by authentications further
   * below! */
  bool abort_upload = (!data->req.upload_done && !little_upload_remains);
  const char *ongoing_auth = NULL;

  /* We need a rewind before uploading client read data again. The
   * checks below just influence of the upload is to be continued
   * or aborted early.
   * This depends on how much remains to be sent and in what state
   * the authentication is. Some auth schemes such as NTLM do not work
   * for a new connection. */
  if(needs_rewind) {
    infof(data, "Need to rewind upload for next request");
    Curl_creader_set_rewind(data, TRUE);
  }

  if(conn->bits.close)
    /* If we already decided to close this connection, we cannot veto. */
    return CURLE_OK;

  if(abort_upload) {
    /* We'd like to abort the upload - but should we? */
#if defined(USE_NTLM)
    if((data->state.authproxy.picked == CURLAUTH_NTLM) ||
       (data->state.authhost.picked == CURLAUTH_NTLM)) {
      ongoing_auth = "NTLM";
      if((conn->http_ntlm_state != NTLMSTATE_NONE) ||
         (conn->proxy_ntlm_state != NTLMSTATE_NONE)) {
        /* The NTLM-negotiation has started, keep on sending.
         * Need to do further work on same connection */
        abort_upload = FALSE;
      }
    }
#endif
#if defined(USE_SPNEGO)
    /* There is still data left to send */
    if((data->state.authproxy.picked == CURLAUTH_NEGOTIATE) ||
       (data->state.authhost.picked == CURLAUTH_NEGOTIATE)) {
      ongoing_auth = "NEGOTIATE";
      if((conn->http_negotiate_state != GSS_AUTHNONE) ||
         (conn->proxy_negotiate_state != GSS_AUTHNONE)) {
        /* The NEGOTIATE-negotiation has started, keep on sending.
         * Need to do further work on same connection */
        abort_upload = FALSE;
      }
    }
#endif
  }

  if(abort_upload) {
    if(upload_remain >= 0)
      infof(data, "%s%sclose instead of sending %" FMT_OFF_T " more bytes",
            ongoing_auth ? ongoing_auth : "",
            ongoing_auth ? " send, " : "",
            upload_remain);
    else
      infof(data, "%s%sclose instead of sending unknown amount "
            "of more bytes",
            ongoing_auth ? ongoing_auth : "",
            ongoing_auth ? " send, " : "");
    /* We decided to abort the ongoing transfer */
    streamclose(conn, "Mid-auth HTTP and much data left to send");
    data->req.size = 0; /* do not download any more than 0 bytes */
  }
  return CURLE_OK;
}